

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionInfo * __thiscall Js::FunctionBody::GetStackNestedFuncParentStrongRef(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  void *pvVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  
  pvVar3 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,StackNestedFuncParent);
  if (pvVar3 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1062,"(this->GetStackNestedFuncParent() != nullptr)",
                                "this->GetStackNestedFuncParent() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  puVar5 = (undefined8 *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,StackNestedFuncParent);
  return (FunctionInfo *)*puVar5;
}

Assistant:

FunctionInfo * FunctionBody::GetStackNestedFuncParentStrongRef()
    {
        Assert(this->GetStackNestedFuncParent() != nullptr);
        return this->GetStackNestedFuncParent()->Get();
    }